

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QList<QMdiSubWindow_*> * __thiscall
QMdiAreaPrivate::subWindowList(QMdiAreaPrivate *this,WindowOrder order,bool reversed)

{
  byte bVar1;
  bool bVar2;
  QMdiSubWindow *pQVar3;
  const_iterator o;
  qsizetype qVar4;
  QList<QPointer<QMdiSubWindow>_> *this_00;
  byte in_CL;
  int in_EDX;
  long in_RSI;
  QList<QMdiSubWindow_*> *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child_2;
  int i;
  QObject *object;
  QObjectList *__range3;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range2;
  QList<QMdiSubWindow_*> *list;
  QMdiSubWindow *child_1;
  const_iterator __end3;
  const_iterator __begin3;
  const_iterator __end2;
  const_iterator __begin2;
  parameter_type in_stack_ffffffffffffff48;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffff50;
  int local_84;
  const_iterator local_28;
  QPointer<QMdiSubWindow> *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QMdiSubWindow_*>::QList((QList<QMdiSubWindow_*> *)0x610533);
  bVar2 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x610544);
  if (!bVar2) {
    if (in_EDX == 0) {
      local_10.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<QPointer<QMdiSubWindow>_>::begin
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff50);
      local_18.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QList<QPointer<QMdiSubWindow>_>::end
                           ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff50);
      while( true ) {
        local_20 = local_18.i;
        bVar2 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_10,local_18);
        if (!bVar2) break;
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_10);
        pQVar3 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x610608);
        if (pQVar3 != (QMdiSubWindow *)0x0) {
          if (bVar1 == 0) {
            QList<QMdiSubWindow_*>::append
                      ((QList<QMdiSubWindow_*> *)0x61062d,in_stack_ffffffffffffff48);
          }
          else {
            QList<QMdiSubWindow_*>::prepend
                      ((QList<QMdiSubWindow_*> *)0x61063e,in_stack_ffffffffffffff48);
          }
        }
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_10);
      }
    }
    else if (in_EDX == 1) {
      QObject::children((QObject *)0x610682);
      local_28.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_ffffffffffffff50);
      o = QList<QObject_*>::end((QList<QObject_*> *)in_stack_ffffffffffffff50);
      while (bVar2 = QList<QObject_*>::const_iterator::operator!=(&local_28,o), bVar2) {
        QList<QObject_*>::const_iterator::operator*(&local_28);
        pQVar3 = qobject_cast<QMdiSubWindow*>((QObject *)0x610716);
        if ((pQVar3 != (QMdiSubWindow *)0x0) &&
           (bVar2 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::contains<QMdiSubWindow*>
                              (in_stack_ffffffffffffff50,(QMdiSubWindow **)in_stack_ffffffffffffff48
                              ), bVar2)) {
          if (bVar1 == 0) {
            QList<QMdiSubWindow_*>::append
                      ((QList<QMdiSubWindow_*> *)0x610755,in_stack_ffffffffffffff48);
          }
          else {
            QList<QMdiSubWindow_*>::prepend
                      ((QList<QMdiSubWindow_*> *)0x610766,in_stack_ffffffffffffff48);
          }
        }
        QList<QObject_*>::const_iterator::operator++(&local_28);
      }
    }
    else {
      qVar4 = QList<int>::size((QList<int> *)(in_RSI + 0x370));
      local_84 = (int)qVar4;
      while (local_84 = local_84 + -1, -1 < local_84) {
        this_00 = (QList<QPointer<QMdiSubWindow>_> *)(in_RSI + 0x358);
        QList<int>::at((QList<int> *)this_00,(qsizetype)in_stack_ffffffffffffff48);
        QList<QPointer<QMdiSubWindow>_>::at(this_00,(qsizetype)in_stack_ffffffffffffff48);
        pQVar3 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6107dc);
        if (pQVar3 != (QMdiSubWindow *)0x0) {
          if (bVar1 == 0) {
            QList<QMdiSubWindow_*>::append
                      ((QList<QMdiSubWindow_*> *)0x610801,in_stack_ffffffffffffff48);
          }
          else {
            QList<QMdiSubWindow_*>::prepend
                      ((QList<QMdiSubWindow_*> *)0x610812,in_stack_ffffffffffffff48);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QMdiSubWindow*>
QMdiAreaPrivate::subWindowList(QMdiArea::WindowOrder order, bool reversed) const
{
    QList<QMdiSubWindow *> list;
    if (childWindows.isEmpty())
        return list;

    if (order == QMdiArea::CreationOrder) {
        for (QMdiSubWindow *child : childWindows) {
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else if (order == QMdiArea::StackingOrder) {
        for (QObject *object : viewport->children()) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else { // ActivationHistoryOrder
        Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());
        for (int i = indicesToActivatedChildren.size() - 1; i >= 0; --i) {
            QMdiSubWindow *child = childWindows.at(indicesToActivatedChildren.at(i));
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    }
    return list;
}